

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

NetlistPortDeclaration * __thiscall
netlist::Netlist::addPortDeclaration(Netlist *this,Symbol *symbol)

{
  pointer this_00;
  unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *in_RDI;
  NetlistPortDeclaration *node;
  __single_object nodePtr;
  string *in_stack_00000208;
  Symbol *in_stack_00000210;
  value_type *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
  *this_01;
  unique_ptr<netlist::NetlistPortDeclaration,_std::default_delete<netlist::NetlistPortDeclaration>_>
  local_38 [3];
  NetlistPortDeclaration *local_20;
  
  std::make_unique<netlist::NetlistPortDeclaration,slang::ast::Symbol_const&>
            ((Symbol *)&stack0xffffffffffffffe8);
  this_00 = std::
            unique_ptr<netlist::NetlistPortDeclaration,_std::default_delete<netlist::NetlistPortDeclaration>_>
            ::operator->((unique_ptr<netlist::NetlistPortDeclaration,_std::default_delete<netlist::NetlistPortDeclaration>_>
                          *)0x1c47d6);
  local_20 = NetlistNode::as<netlist::NetlistPortDeclaration>(&this_00->super_NetlistNode);
  slang::ast::Symbol::appendHierarchicalPath(in_stack_00000210,in_stack_00000208);
  this_01 = (vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
             *)(in_RDI + 1);
  std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>::
  unique_ptr<netlist::NetlistPortDeclaration,std::default_delete<netlist::NetlistPortDeclaration>,void>
            (in_RDI,local_38);
  std::
  vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
  ::push_back(this_01,in_stack_ffffffffffffff98);
  std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>::~unique_ptr
            ((unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)this_01
            );
  std::
  unique_ptr<netlist::NetlistPortDeclaration,_std::default_delete<netlist::NetlistPortDeclaration>_>
  ::~unique_ptr((unique_ptr<netlist::NetlistPortDeclaration,_std::default_delete<netlist::NetlistPortDeclaration>_>
                 *)this_01);
  return local_20;
}

Assistant:

NetlistPortDeclaration& addPortDeclaration(const ast::Symbol& symbol) {
        auto nodePtr = std::make_unique<NetlistPortDeclaration>(symbol);
        auto& node = nodePtr->as<NetlistPortDeclaration>();
        symbol.appendHierarchicalPath(node.hierarchicalPath);
        SLANG_ASSERT(lookupPort(nodePtr->hierarchicalPath) == nullptr &&
                     "Port declaration already exists");
        nodes.push_back(std::move(nodePtr));
        DEBUG_PRINT("New node: port declaration {}\n", node.hierarchicalPath);
        return node;
    }